

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O1

bool __thiscall xray_re::xr_ogf_v4::hierarchical(xr_ogf_v4 *this)

{
  ogf_model_type oVar1;
  
  oVar1 = (this->super_xr_ogf).m_model_type;
  return (bool)((byte)(0x44a >> ((byte)oVar1 & 0x1f)) & oVar1 < MT3_LOD);
}

Assistant:

bool xr_ogf_v4::hierarchical() const
{
	switch (m_model_type) {
	case MT4_HIERRARHY:
	case MT4_SKELETON_ANIM:
	case MT4_SKELETON_RIGID:
	case MT4_LOD:
		return true;
	default:
		return false;
	}
}